

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFullyConnected.cpp
# Opt level: O0

bool tfs::localTestTrainer(DnnTrainerSGD *trainer,Dnn *dnn)

{
  bool bVar1;
  unsigned_long uVar2;
  long lVar3;
  double *pdVar4;
  DnnTrainer *pDVar5;
  TMatrix<double> *this;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  double dVar6;
  DNN_NUMERIC *curr;
  DNN_NUMERIC *prev;
  DNN_INTEGER index;
  Matrix previous;
  DNN_NUMERIC bb;
  DNN_NUMERIC aa;
  DNN_NUMERIC *data;
  Matrix *output;
  Matrix *input;
  int ii;
  undefined6 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1e;
  undefined1 in_stack_ffffffffffffff1f;
  TMatrix<double> *in_stack_ffffffffffffff20;
  DnnTrainer *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff34;
  undefined1 in_stack_ffffffffffffff35;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  TMatrix<double> local_98;
  double local_48;
  double local_40;
  double *local_38;
  Matrix *local_30;
  TMatrix<double> *local_28;
  uint local_1c;
  byte in_stack_ffffffffffffffff;
  
  local_1c = 0;
  do {
    if (99 < (int)local_1c) {
      in_stack_ffffffffffffffff = 1;
LAB_00116bed:
      return (bool)(in_stack_ffffffffffffffff & 1);
    }
    local_28 = Dnn::getMatrixInput((Dnn *)in_stack_ffffffffffffff20);
    local_30 = Dnn::getMatrixOutput((Dnn *)in_stack_ffffffffffffff20);
    if (local_28 == (TMatrix<double> *)0x0) {
      in_stack_ffffffffffffffff =
           report_problem("Error",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testFullyConnected.cpp"
                          ,"localTestTrainer",0x75,"Input matrix is null");
      goto LAB_00116bed;
    }
    uVar2 = TMatrix<double>::count(local_28);
    if (uVar2 != 2) {
      uVar2 = TMatrix<double>::count(local_28);
      in_stack_ffffffffffffffff =
           report_problem("Error",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testFullyConnected.cpp"
                          ,"localTestTrainer",0x78,"Input matrix expected count = 2, was %lu",uVar2)
      ;
      goto LAB_00116bed;
    }
    if (local_30 == (TMatrix<double> *)0x0) {
      in_stack_ffffffffffffffff =
           report_problem("Error",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testFullyConnected.cpp"
                          ,"localTestTrainer",0x7b,"Output matrix is null");
      goto LAB_00116bed;
    }
    uVar2 = TMatrix<double>::count(local_30);
    if (uVar2 != 3) {
      uVar2 = TMatrix<double>::count(local_30);
      in_stack_ffffffffffffffff =
           report_problem("Error",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testFullyConnected.cpp"
                          ,"localTestTrainer",0x7e,"Output matrix expected count = 3, was %lu",uVar2
                         );
      goto LAB_00116bed;
    }
    local_38 = TMatrix<double>::data(local_28);
    if (local_38 == (double *)0x0) {
      in_stack_ffffffffffffffff =
           report_problem("Error",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testFullyConnected.cpp"
                          ,"localTestTrainer",0x82,"Input data is null");
      goto LAB_00116bed;
    }
    random();
    local_40 = extraout_XMM0_Qa;
    random();
    *local_38 = local_40;
    local_38[1] = extraout_XMM0_Qa_00;
    local_48 = extraout_XMM0_Qa_00;
    local_38 = local_38 + 1;
    bVar1 = Dnn::forward((Dnn *)CONCAT17(in_stack_ffffffffffffff1f,
                                         CONCAT16(in_stack_ffffffffffffff1e,
                                                  in_stack_ffffffffffffff18)));
    if (!bVar1) {
      in_stack_ffffffffffffffff =
           report_problem("Error",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testFullyConnected.cpp"
                          ,"localTestTrainer",0x89,"Error during feed forward");
      goto LAB_00116bed;
    }
    this = &local_98;
    TMatrix<double>::TMatrix
              ((TMatrix<double> *)
               CONCAT17(in_stack_ffffffffffffff37,
                        CONCAT16(in_stack_ffffffffffffff36,
                                 CONCAT15(in_stack_ffffffffffffff35,
                                          CONCAT14(in_stack_ffffffffffffff34,
                                                   in_stack_ffffffffffffff30)))),
               (TMatrix<double> *)in_stack_ffffffffffffff28,
               SUB81((ulong)in_stack_ffffffffffffff20 >> 0x38,0));
    random((tfs *)this);
    dVar6 = floor(__x);
    lVar3 = (long)dVar6;
    if ((lVar3 < 0) || (3 < lVar3)) {
      in_stack_ffffffffffffff37 =
           report_problem("Error",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testFullyConnected.cpp"
                          ,"localTestTrainer",0x8e,"Index out of range: %ld",lVar3);
      bVar1 = true;
      in_stack_ffffffffffffffff = in_stack_ffffffffffffff37;
    }
    else {
      DnnTrainer::train(in_stack_ffffffffffffff28,(DNN_INTEGER)in_stack_ffffffffffffff20);
      pdVar4 = TMatrix<double>::data(local_28);
      local_38 = pdVar4 + 1;
      if ((*pdVar4 == local_40) && (!NAN(*pdVar4) && !NAN(local_40))) {
        if ((*local_38 == local_48) && (!NAN(*local_38) && !NAN(local_48))) {
          in_stack_ffffffffffffff35 =
               Dnn::forward((Dnn *)CONCAT17(in_stack_ffffffffffffff1f,
                                            CONCAT16(in_stack_ffffffffffffff1e,
                                                     in_stack_ffffffffffffff18)));
          if ((bool)in_stack_ffffffffffffff35) {
            pDVar5 = (DnnTrainer *)TMatrix<double>::dataReadOnly(&local_98);
            in_stack_ffffffffffffff28 = pDVar5;
            in_stack_ffffffffffffff20 = (TMatrix<double> *)TMatrix<double>::dataReadOnly(local_30);
            if ((pDVar5 == (DnnTrainer *)0x0) ||
               (in_stack_ffffffffffffff20 == (TMatrix<double> *)0x0)) {
              in_stack_ffffffffffffff1f =
                   report_problem("Error",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testFullyConnected.cpp"
                                  ,"localTestTrainer",0x9b,"Null data");
              bVar1 = true;
              in_stack_ffffffffffffffff = in_stack_ffffffffffffff1f;
            }
            else if ((double)(&pDVar5->_vptr_DnnTrainer)[lVar3] <
                     (double)(&in_stack_ffffffffffffff20->m_a)[lVar3]) {
              bVar1 = false;
            }
            else {
              in_stack_ffffffffffffff1e =
                   report_problem((char *)(&in_stack_ffffffffffffff20->m_a)[lVar3],
                                  (char *)(&pDVar5->_vptr_DnnTrainer)[lVar3],"Error",0x12c890,
                                  "localTestTrainer",0x9e,
                                  "Current weight (%f) should be larger than previous (%f). ii = %d"
                                  ,(ulong)local_1c);
              bVar1 = true;
              in_stack_ffffffffffffffff = in_stack_ffffffffffffff1e;
            }
          }
          else {
            in_stack_ffffffffffffff34 =
                 report_problem("Error",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testFullyConnected.cpp"
                                ,"localTestTrainer",0x96,"Error during feed forward");
            bVar1 = true;
            in_stack_ffffffffffffffff = in_stack_ffffffffffffff34;
          }
          goto LAB_00116bb7;
        }
      }
      in_stack_ffffffffffffff36 =
           report_problem("Error",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/testFullyConnected.cpp"
                          ,"localTestTrainer",0x93,"Input data changed during training.");
      bVar1 = true;
      in_stack_ffffffffffffffff = in_stack_ffffffffffffff36;
    }
LAB_00116bb7:
    TMatrix<double>::~TMatrix(in_stack_ffffffffffffff20);
    if (bVar1) goto LAB_00116bed;
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

static bool
    localTestTrainer( DnnTrainerSGD &trainer, Dnn &dnn ) {
        // --------------------------------------------------------------------
        // ok 25 May 2016
        // --------------------------------------------------------------------
        for( int ii = 0; ii < 100; ii++ ) {
            Matrix *input  = dnn.getMatrixInput();          // x,y pair
            Matrix *output = dnn.getMatrixOutput();         //
            if( input == 0 ) {
                return log_error( "Input matrix is null" );
            }
            if( input->count() != 2 ) {
                return log_error( "Input matrix expected count = 2, was %lu", input->count());
            }
            if( output == 0 ) {
                return log_error( "Output matrix is null" );
            }
            if( output->count() != 3 ) {
                return log_error( "Output matrix expected count = 3, was %lu", output->count());
            }
            DNN_NUMERIC *data = input->data();
            if( data == 0 ) {
                return log_error( "Input data is null" );
            }
            const DNN_NUMERIC aa = random( -1.0, 1.0 );
            const DNN_NUMERIC bb = random( -1.0, 1.0 );
            *data++ = aa;
            *data   = bb;
            if( !dnn.forward()) {
                return log_error( "Error during feed forward" );
            }
            Matrix previous = Matrix( *output, true );          // Copy output
            const DNN_INTEGER index = (DNN_INTEGER) floor( random( 3.0 ));    // Index 0 to 2.
            if( index < 0 || index > 3 ) {
                return log_error( "Index out of range: %ld", index );
            }
            trainer.train( index );
            data = input->data();
            if( *data++ != aa || *data != bb ) {
                return log_error( "Input data changed during training." );
            }
            if( !dnn.forward()) {
                return log_error( "Error during feed forward" );
            }
            const DNN_NUMERIC *prev = previous.dataReadOnly();
            const DNN_NUMERIC *curr = output->dataReadOnly();
            if( prev == 0 || curr == 0 ) {
                return log_error( "Null data" );
            }
            if( curr[index] <= prev[index] ) {
                return log_error( "Current weight (%f) should be larger than previous (%f). ii = %d", curr[index], prev[index], ii );
            }
            
        }
        return true;
    }